

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseUnion
          (StructTranslator *this,Reader *decl,Reader members,MemberInfo *parent,Union *layout,
          uint *codeOrder)

{
  ErrorReporter *pEVar1;
  Reader parent_00;
  Reader members_00;
  Reader parent_01;
  Reader members_01;
  Reader decl_00;
  Reader decl_01;
  Union *pUVar2;
  MemberInfo *decl_02;
  bool bVar3;
  Which WVar4;
  uint uVar5;
  uint64_t uVar6;
  Iterator IVar7;
  ArrayPtr<const_char> AVar8;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> pVar9;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> local_460;
  uint *local_450;
  uint *o;
  uint *_o1258;
  CapTableReader *pCStack_438;
  byte *local_430;
  ListElementCount LStack_428;
  BitsPerElementN<23> BStack_424;
  StructDataBitCount local_420;
  StructPointerCount SStack_41c;
  ElementSize EStack_41a;
  undefined1 uStack_419;
  int iStack_418;
  undefined4 uStack_414;
  bool local_409;
  NullableValue<unsigned_int> local_408;
  Reader local_3d8;
  NodeSourceInfoBuilderPair local_3a8;
  uint local_354;
  Group *local_350;
  Group *group;
  Reader local_318;
  uint local_2e4;
  Reader local_2e0;
  Reader local_2b0;
  uint local_280;
  bool local_279;
  uint subCodeOrder;
  Reader local_248;
  NodeSourceInfoBuilderPair local_218;
  uint local_1c4;
  Union *local_1c0;
  Union *unionLayout;
  Group *singletonGroup_1;
  StringPtr local_1a0;
  Reader local_190;
  ArrayPtr<const_char> local_160;
  Reader local_150;
  Reader local_120;
  uint local_ec;
  bool local_e5;
  uint local_e4;
  Group *local_e0;
  Group *singletonGroup;
  MemberInfo *local_c8;
  MemberInfo *memberInfo;
  Maybe<unsigned_int> ordinal;
  Reader member;
  undefined1 local_78 [8];
  Iterator __end2;
  undefined1 local_58 [8];
  Iterator __begin2;
  Reader *__range2;
  uint *local_30;
  uint *codeOrder_local;
  Union *layout_local;
  MemberInfo *parent_local;
  Reader *decl_local;
  StructTranslator *this_local;
  
  local_30 = codeOrder;
  codeOrder_local = (uint *)layout;
  layout_local = (Union *)parent;
  parent_local = (MemberInfo *)decl;
  decl_local = (Reader *)this;
  uVar5 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::size(&members);
  decl_02 = parent_local;
  if (uVar5 < 2) {
    pEVar1 = this->errorReporter;
    kj::StringPtr::StringPtr((StringPtr *)&__range2,"Union must have at least two members.");
    ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader_const&>
              (pEVar1,(Reader *)decl_02,(StringPtr)___range2);
  }
  __begin2._8_8_ = &members;
  IVar7 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::begin(&members);
  __end2._8_8_ = IVar7.container;
  __begin2.container._0_4_ = IVar7.index;
  local_58 = (undefined1  [8])__end2._8_8_;
  IVar7 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  local_78 = (undefined1  [8])IVar7.container;
  __end2.container._0_4_ = IVar7.index;
  while( true ) {
    bVar3 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                          *)local_58,
                         (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                          *)local_78);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*((Reader *)&ordinal,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 *)local_58);
    kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)&memberInfo);
    local_c8 = (MemberInfo *)0x0;
    WVar4 = Declaration::Reader::which((Reader *)&ordinal);
    if (WVar4 == FIELD) {
      (layout_local->discriminantOffset).ptr.field_1.value =
           (layout_local->discriminantOffset).ptr.field_1.value + 1;
      local_e0 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                           (&this->arena,(Union *)codeOrder_local);
      local_e4 = *local_30;
      *local_30 = local_e4 + 1;
      local_e5 = true;
      local_c8 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::Group&,bool>
                           (&this->arena,(MemberInfo *)layout_local,&local_e4,(Reader *)&ordinal,
                            local_e0,&local_e5);
      kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
      add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                ((Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
                 &this->allMembers,&local_c8);
      Declaration::Reader::getId(&local_150,(Reader *)&ordinal);
      Declaration::Id::Reader::getOrdinal(&local_120,&local_150);
      uVar6 = LocatedInteger::Reader::getValue(&local_120);
      local_ec = (uint)uVar6;
      kj::Maybe<unsigned_int>::operator=((Maybe<unsigned_int> *)&memberInfo,&local_ec);
    }
    else if (WVar4 == UNION) {
      Declaration::Reader::getName(&local_190,(Reader *)&ordinal);
      AVar8 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_190);
      local_160 = AVar8;
      kj::StringPtr::StringPtr(&local_1a0,"");
      bVar3 = kj::StringPtr::operator==((StringPtr *)&local_160,&local_1a0);
      if (bVar3) {
        pEVar1 = this->errorReporter;
        kj::StringPtr::StringPtr
                  ((StringPtr *)&singletonGroup_1,"Unions cannot contain unnamed unions.");
        ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>
                  (pEVar1,(Reader *)&ordinal,(StringPtr)_singletonGroup_1);
      }
      else {
        (layout_local->discriminantOffset).ptr.field_1.value =
             (layout_local->discriminantOffset).ptr.field_1.value + 1;
        unionLayout = (Union *)kj::Arena::
                               allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                                         (&this->arena,(Union *)codeOrder_local);
        local_1c0 = kj::Arena::
                    allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::Group&>
                              (&this->arena,(Group *)unionLayout);
        pUVar2 = layout_local;
        local_1c4 = *local_30;
        *local_30 = local_1c4 + 1;
        capnp::schema::Node::Builder::operator_cast_to_Reader
                  (&local_248,(Builder *)&layout_local[3].pointerLocations.builder.pos);
        _subCodeOrder = ordinal.ptr;
        parent_00._reader.capTable = local_248._reader.capTable;
        parent_00._reader.segment = local_248._reader.segment;
        parent_00._reader.data = local_248._reader.data;
        parent_00._reader.pointers = local_248._reader.pointers;
        parent_00._reader.dataSize = local_248._reader.dataSize;
        parent_00._reader.pointerCount = local_248._reader.pointerCount;
        parent_00._reader._38_2_ = local_248._reader._38_2_;
        parent_00._reader.nestingLimit = local_248._reader.nestingLimit;
        parent_00._reader._44_4_ = local_248._reader._44_4_;
        decl_00._reader.capTable = (CapTableReader *)member._reader.segment;
        decl_00._reader.segment = (SegmentReader *)ordinal.ptr;
        decl_00._reader.data = member._reader.capTable;
        decl_00._reader.pointers = (WirePointer *)member._reader.data;
        decl_00._reader._32_8_ = member._reader.pointers;
        decl_00._reader._40_8_ = member._reader._32_8_;
        newGroupNode(&local_218,this,parent_00,decl_00);
        local_279 = true;
        local_c8 = kj::Arena::
                   allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                             (&this->arena,(MemberInfo *)pUVar2,&local_1c4,(Reader *)&ordinal,
                              &local_218,&local_279);
        kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
        add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                  ((Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
                   &this->allMembers,&local_c8);
        (local_c8->field_21).unionScope = local_1c0;
        local_280 = 0;
        Declaration::Reader::getNestedDecls(&local_2b0,(Reader *)&ordinal);
        members_00.reader.capTable = local_2b0.reader.capTable;
        members_00.reader.segment = local_2b0.reader.segment;
        members_00.reader.ptr = local_2b0.reader.ptr;
        members_00.reader.elementCount = local_2b0.reader.elementCount;
        members_00.reader.step = local_2b0.reader.step;
        members_00.reader.structDataSize = local_2b0.reader.structDataSize;
        members_00.reader.structPointerCount = local_2b0.reader.structPointerCount;
        members_00.reader.elementSize = local_2b0.reader.elementSize;
        members_00.reader._39_1_ = local_2b0.reader._39_1_;
        members_00.reader.nestingLimit = local_2b0.reader.nestingLimit;
        members_00.reader._44_4_ = local_2b0.reader._44_4_;
        traverseUnion(this,(Reader *)&ordinal,members_00,local_c8,local_1c0,&local_280);
        Declaration::Reader::getId(&local_2e0,(Reader *)&ordinal);
        bVar3 = Declaration::Id::Reader::isOrdinal(&local_2e0);
        if (bVar3) {
          Declaration::Reader::getId((Reader *)&group,(Reader *)&ordinal);
          Declaration::Id::Reader::getOrdinal(&local_318,(Reader *)&group);
          uVar6 = LocatedInteger::Reader::getValue(&local_318);
          local_2e4 = (uint)uVar6;
          kj::Maybe<unsigned_int>::operator=((Maybe<unsigned_int> *)&memberInfo,&local_2e4);
        }
      }
    }
    else if (WVar4 == GROUP) {
      (layout_local->discriminantOffset).ptr.field_1.value =
           (layout_local->discriminantOffset).ptr.field_1.value + 1;
      local_350 = kj::Arena::
                  allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                            (&this->arena,(Union *)codeOrder_local);
      pUVar2 = layout_local;
      local_354 = *local_30;
      *local_30 = local_354 + 1;
      capnp::schema::Node::Builder::operator_cast_to_Reader
                (&local_3d8,(Builder *)&layout_local[3].pointerLocations.builder.pos);
      local_408 = ordinal.ptr;
      parent_01._reader.capTable = local_3d8._reader.capTable;
      parent_01._reader.segment = local_3d8._reader.segment;
      parent_01._reader.data = local_3d8._reader.data;
      parent_01._reader.pointers = local_3d8._reader.pointers;
      parent_01._reader.dataSize = local_3d8._reader.dataSize;
      parent_01._reader.pointerCount = local_3d8._reader.pointerCount;
      parent_01._reader._38_2_ = local_3d8._reader._38_2_;
      parent_01._reader.nestingLimit = local_3d8._reader.nestingLimit;
      parent_01._reader._44_4_ = local_3d8._reader._44_4_;
      decl_01._reader.capTable = (CapTableReader *)member._reader.segment;
      decl_01._reader.segment = (SegmentReader *)ordinal.ptr;
      decl_01._reader.data = member._reader.capTable;
      decl_01._reader.pointers = (WirePointer *)member._reader.data;
      decl_01._reader._32_8_ = member._reader.pointers;
      decl_01._reader._40_8_ = member._reader._32_8_;
      newGroupNode(&local_3a8,this,parent_01,decl_01);
      local_409 = true;
      local_c8 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                           (&this->arena,(MemberInfo *)pUVar2,&local_354,(Reader *)&ordinal,
                            &local_3a8,&local_409);
      kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
      add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                ((Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
                 &this->allMembers,&local_c8);
      Declaration::Reader::getNestedDecls((Reader *)&_o1258,(Reader *)&ordinal);
      members_01.reader.capTable = pCStack_438;
      members_01.reader.segment = (SegmentReader *)_o1258;
      members_01.reader.ptr = local_430;
      members_01.reader.elementCount = LStack_428;
      members_01.reader.step = BStack_424;
      members_01.reader.structDataSize = local_420;
      members_01.reader.structPointerCount = SStack_41c;
      members_01.reader.elementSize = EStack_41a;
      members_01.reader._39_1_ = uStack_419;
      members_01.reader.nestingLimit = iStack_418;
      members_01.reader._44_4_ = uStack_414;
      traverseGroup(this,members_01,local_c8,&local_350->super_StructOrGroup);
    }
    o = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&memberInfo);
    if (o != (uint *)0x0) {
      local_450 = o;
      pVar9 = std::
              make_pair<unsigned_int&,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                        (o,&local_c8);
      local_460.second = pVar9.second;
      local_460.first = pVar9.first;
      std::
      multimap<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
      ::
      insert<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                ((multimap<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                  *)&this->membersByOrdinal,&local_460);
    }
    kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&memberInfo);
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                  *)local_58);
  }
  return;
}

Assistant:

void traverseUnion(const Declaration::Reader& decl,
                     List<Declaration>::Reader members, MemberInfo& parent,
                     StructLayout::Union& layout, uint& codeOrder) {
    if (members.size() < 2) {
      errorReporter.addErrorOn(decl, "Union must have at least two members.");
    }

    for (auto member: members) {
      kj::Maybe<uint> ordinal;
      MemberInfo* memberInfo = nullptr;

      switch (member.which()) {
        case Declaration::FIELD: {
          parent.childCount++;
          // For layout purposes, pretend this field is enclosed in a one-member group.
          StructLayout::Group& singletonGroup =
              arena.allocate<StructLayout::Group>(layout);
          memberInfo = &arena.allocate<MemberInfo>(parent, codeOrder++, member, singletonGroup,
                                                   true);
          allMembers.add(memberInfo);
          ordinal = member.getId().getOrdinal().getValue();
          break;
        }

        case Declaration::UNION:
          if (member.getName().getValue() == "") {
            errorReporter.addErrorOn(member, "Unions cannot contain unnamed unions.");
          } else {
            parent.childCount++;

            // For layout purposes, pretend this union is enclosed in a one-member group.
            StructLayout::Group& singletonGroup =
                arena.allocate<StructLayout::Group>(layout);
            StructLayout::Union& unionLayout = arena.allocate<StructLayout::Union>(singletonGroup);

            memberInfo = &arena.allocate<MemberInfo>(
                parent, codeOrder++, member,
                newGroupNode(parent.node, member),
                true);
            allMembers.add(memberInfo);
            memberInfo->unionScope = &unionLayout;
            uint subCodeOrder = 0;
            traverseUnion(member, member.getNestedDecls(), *memberInfo, unionLayout, subCodeOrder);
            if (member.getId().isOrdinal()) {
              ordinal = member.getId().getOrdinal().getValue();
            }
          }
          break;

        case Declaration::GROUP: {
          parent.childCount++;
          StructLayout::Group& group = arena.allocate<StructLayout::Group>(layout);
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member,
              newGroupNode(parent.node, member),
              true);
          allMembers.add(memberInfo);
          traverseGroup(member.getNestedDecls(), *memberInfo, group);
          break;
        }

        default:
          // Ignore others.
          break;
      }

      KJ_IF_SOME(o, ordinal) {
        membersByOrdinal.insert(std::make_pair(o, memberInfo));
      }
    }
  }